

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slacking.hpp
# Opt level: O3

void __thiscall slack::_detail::Slacking::setParameters(Slacking *this,string *method,string *data)

{
  CURL *pCVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> complete_url;
  char local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_38,&this->base_url,method);
  std::__cxx11::string::_M_assign((string *)&(this->session_).url_);
  pCVar1 = (this->session_).curl_;
  if (pCVar1 != (CURL *)0x0) {
    curl_easy_setopt(pCVar1,0x3c,data->_M_string_length);
    curl_easy_setopt((this->session_).curl_,0x271f,(data->_M_dataplus)._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,">> sending: ",0xc);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_38._M_dataplus._M_p,local_38._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"  ",2);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(data->_M_dataplus)._M_p,data->_M_string_length);
  local_39 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_39,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

void setParameters(const std::string& method, const std::string& data = "") {
        auto complete_url =  base_url+ method;
        session_.SetUrl(complete_url);
        session_.SetBody(data);

#if SLACKING_VERBOSE_OUTPUT
        std::cout << ">> sending: "<< complete_url << "  " << data << '\n';
#endif

    }